

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabulatedDistributions.test.cpp
# Opt level: O2

void verifyChunk(TabulatedDistributions *chunk)

{
  bool bVar1;
  long lVar2;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef macroName_56;
  StringRef macroName_57;
  StringRef macroName_58;
  StringRef macroName_59;
  StringRef macroName_60;
  StringRef macroName_61;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef capturedExpression_56;
  StringRef capturedExpression_57;
  StringRef capturedExpression_58;
  StringRef capturedExpression_59;
  StringRef capturedExpression_60;
  StringRef capturedExpression_61;
  AssertionHandler catchAssertionHandler_20;
  double local_120;
  undefined1 local_118 [8];
  undefined8 local_110;
  ITransientExpression *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100 [2];
  ITransientExpression local_e0;
  double *local_d0;
  WithinRelMatcher *local_c8;
  TabulatedDistribution d;
  
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xa0;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x13;
  capturedExpression.m_start = "false == chunk.LI()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression,ContinueOnFailure);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001ce2f0;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT53(catchAssertionHandler_20.m_assertionInfo.macroName.m_size._3_5_,0x101);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start =
       (char *)((ulong)catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start &
               0xffffffffffffff00);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xa1;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x27;
  capturedExpression_00.m_start = "false == chunk.isotropicDistributions()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_00,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_00,ContinueOnFailure);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001ce2f0;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT53(catchAssertionHandler_20.m_assertionInfo.macroName.m_size._3_5_,0x101);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start =
       (char *)((ulong)catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start &
               0xffffffffffffff00);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xa2;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x10;
  capturedExpression_01.m_start = "2 == chunk.LTT()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_01,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_01,ContinueOnFailure);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT62(catchAssertionHandler_20.m_assertionInfo.macroName.m_size._2_6_,0x101);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001ce330;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_20.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start._4_4_,2)
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xa3;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x10;
  capturedExpression_02.m_start = "2 == chunk.LAW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_02,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_02,ContinueOnFailure);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT62(catchAssertionHandler_20.m_assertionInfo.macroName.m_size._2_6_,0x101);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001ce330;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_20.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start._4_4_,2)
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xa5;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0xf;
  capturedExpression_03.m_start = "2 == chunk.NE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_03,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_03,ContinueOnFailure);
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start =
       (char *)(*(pointer *)
                 ((long)&(chunk->
                         super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                         ).
                         super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                         .interpolation_.super_InterpolationBase.boundaryIndices.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl + 8))[-1];
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start == (char *)0x2,1
               );
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001ce370;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_20.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xa6;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0x23;
  capturedExpression_04.m_start = "2 == chunk.numberIncidentEnergies()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_04,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_04,ContinueOnFailure);
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start =
       (char *)(*(pointer *)
                 ((long)&(chunk->
                         super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                         ).
                         super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                         .interpolation_.super_InterpolationBase.boundaryIndices.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl + 8))[-1];
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start == (char *)0x2,1
               );
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001ce370;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_20.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xa7;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0xf;
  capturedExpression_05.m_start = "1 == chunk.NR()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_05,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_05,ContinueOnFailure);
  lVar2 = (long)*(pointer *)
                 ((long)&(chunk->
                         super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                         ).
                         super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                         .interpolation_.super_InterpolationBase.boundaryIndices.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl + 8) -
          (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start = (char *)(lVar2 >> 3);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar2 == 8,1);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001ce370;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT44(1,(undefined4)catchAssertionHandler_20.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xa8;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x27;
  capturedExpression_06.m_start = "1 == chunk.numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_06,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_06,ContinueOnFailure);
  lVar2 = (long)*(pointer *)
                 ((long)&(chunk->
                         super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                         ).
                         super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                         .interpolation_.super_InterpolationBase.boundaryIndices.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl + 8) -
          (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start = (char *)(lVar2 >> 3);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar2 == 8,1);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001ce370;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT44(1,(undefined4)catchAssertionHandler_20.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xa9;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x20;
  capturedExpression_07.m_start = "1 == chunk.interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_07,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_07,ContinueOnFailure);
  lVar2 = (long)*(pointer *)
                 ((long)&(chunk->
                         super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                         ).
                         super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                         .interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl + 8) -
          (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start = (char *)(lVar2 >> 3);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar2 == 8,1);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start = "^\x14\x13";
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT44(1,(undefined4)catchAssertionHandler_20.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xaa;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x1e;
  capturedExpression_08.m_start = "1 == chunk.boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_08,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_08,ContinueOnFailure);
  lVar2 = (long)*(pointer *)
                 ((long)&(chunk->
                         super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                         ).
                         super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                         .interpolation_.super_InterpolationBase.boundaryIndices.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl + 8) -
          (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start = (char *)(lVar2 >> 3);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar2 == 8,1);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start = "^\x14\x13";
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT44(1,(undefined4)catchAssertionHandler_20.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xab;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x1c;
  capturedExpression_09.m_start = "1 == chunk.interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_09,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_09,ContinueOnFailure);
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start =
       (char *)*(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start == (char *)0x1,1
               );
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001ce370;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT44(1,(undefined4)catchAssertionHandler_20.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xac;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x1a;
  capturedExpression_10.m_start = "2 == chunk.boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_10,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_10,ContinueOnFailure);
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start =
       (char *)*(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start == (char *)0x2,1
               );
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001ce370;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_20.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xad;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x17;
  capturedExpression_11.m_start = "1 == chunk.INT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_11,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_11,ContinueOnFailure);
  lVar2 = (long)*(pointer *)
                 ((long)&(chunk->
                         super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                         ).
                         super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                         .interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl + 8) -
          (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start = (char *)(lVar2 >> 3);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar2 == 8,1);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start = "^\x14\x13";
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT44(1,(undefined4)catchAssertionHandler_20.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xae;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x17;
  capturedExpression_12.m_start = "1 == chunk.NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_12,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_12,ContinueOnFailure);
  lVar2 = (long)*(pointer *)
                 ((long)&(chunk->
                         super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                         ).
                         super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                         .interpolation_.super_InterpolationBase.boundaryIndices.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl + 8) -
          (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start = (char *)(lVar2 >> 3);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar2 == 8,1);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start = "^\x14\x13";
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT44(1,(undefined4)catchAssertionHandler_20.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xaf;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0x13;
  capturedExpression_13.m_start = "1 == chunk.INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_13,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_13,ContinueOnFailure);
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start =
       (char *)*(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start == (char *)0x1,1
               );
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001ce370;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT44(1,(undefined4)catchAssertionHandler_20.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xb0;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0x13;
  capturedExpression_14.m_start = "2 == chunk.NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_14,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_14,ContinueOnFailure);
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start =
       (char *)*(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start == (char *)0x2,1
               );
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001ce370;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_20.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xb2;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x24;
  capturedExpression_15.m_start = "2 == chunk.incidentEnergies().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_15,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_15,ContinueOnFailure);
  lVar2 = (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                .sequence_.
                super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                .sequence_.
                super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
                ._M_impl.super__Vector_impl_data._M_start;
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start = (char *)(lVar2 / 0x90);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar2 == 0x120,1);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start = "^\x14\x13";
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_20.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xb3;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x28;
  capturedExpression_16.m_start = "2 == chunk.angularDistributions().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_16,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_16,ContinueOnFailure);
  lVar2 = (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                .sequence_.
                super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                .sequence_.
                super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
                ._M_impl.super__Vector_impl_data._M_start;
  catchAssertionHandler_20.m_assertionInfo.capturedExpression.m_start = (char *)(lVar2 / 0x90);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar2 == 0x120,1);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start = "^\x14\x13";
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_20.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_20.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_20.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&d,(ITransientExpression *)&catchAssertionHandler_20);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xb5;
  macroName_17.m_size = 10;
  macroName_17.m_start = "CHECK_THAT";
  capturedExpression_17.m_size = 0x2e;
  capturedExpression_17.m_start = "1e-5, WithinRel( chunk.incidentEnergies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_17,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_17,ContinueOnFailure);
  local_e0._vptr_ITransientExpression = (_func_int **)0x3ee4f8b588e368f1;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_20,
             ((_Head_base<1UL,_double,_false> *)
             ((long)&(((chunk->
                       super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                       ).
                       super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                       .sequence_.
                       super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_TabulationRecord).
                     super_InterpolationBase.metadata + 0x20))->_M_head_impl);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&catchAssertionHandler_20,(double *)&local_e0);
  local_110._1_1_ = bVar1;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce3f0;
  local_108 = &local_e0;
  local_100[0]._0_8_ = &catchAssertionHandler_20;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&d,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  catchAssertionHandler_20.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/4/TabulatedDistributions/test/TabulatedDistributions.test.cpp"
  ;
  catchAssertionHandler_20.m_assertionInfo.macroName.m_size = 0xb6;
  macroName_18.m_size = 10;
  macroName_18.m_start = "CHECK_THAT";
  capturedExpression_18.m_size = 0x2e;
  capturedExpression_18.m_start = "2e+7, WithinRel( chunk.incidentEnergies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&d,macroName_18,(SourceLineInfo *)&catchAssertionHandler_20,
             capturedExpression_18,ContinueOnFailure);
  local_e0._vptr_ITransientExpression = (_func_int **)0x417312d000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_20,
             ((_Head_base<1UL,_double,_false> *)
             ((long)&(chunk->
                     super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                     ).
                     super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                     .sequence_.
                     super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].super_TabulationRecord.
                     super_InterpolationBase.metadata + 0x20))->_M_head_impl);
  local_110._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_20,(double *)&local_e0);
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce3f0;
  local_108 = &local_e0;
  local_100[0]._0_8_ = &catchAssertionHandler_20;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&d,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_20);
  Catch::AssertionHandler::complete((AssertionHandler *)&d);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&d);
  njoy::ENDFtk::TabulationRecord::TabulationRecord
            (&d.super_TabulationRecord,
             &((chunk->
               super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
               super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
               .sequence_.
               super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
               ._M_impl.super__Vector_impl_data._M_start)->super_TabulationRecord);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xbb;
  macroName_19.m_size = 10;
  macroName_19.m_start = "CHECK_THAT";
  capturedExpression_19.m_size = 0x18;
  capturedExpression_19.m_start = "1e-5, WithinRel( d.E() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_19,(SourceLineInfo *)local_118,
             capturedExpression_19,ContinueOnFailure);
  local_120 = 1e-05;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_118,
             d.super_TabulationRecord.super_InterpolationBase.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  local_e0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_118,&local_120);
  local_e0.m_isBinaryExpression = true;
  local_e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ce3f0;
  local_d0 = &local_120;
  local_c8 = (WithinRelMatcher *)local_118;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,&local_e0);
  Catch::ITransientExpression::~ITransientExpression(&local_e0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xbc;
  macroName_20.m_size = 10;
  macroName_20.m_start = "CHECK_THAT";
  capturedExpression_20.m_size = 0x25;
  capturedExpression_20.m_start = "1e-5, WithinRel( d.incidentEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_20,(SourceLineInfo *)local_118,
             capturedExpression_20,ContinueOnFailure);
  local_120 = 1e-05;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_118,
             d.super_TabulationRecord.super_InterpolationBase.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  local_e0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_118,&local_120);
  local_e0.m_isBinaryExpression = true;
  local_e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ce3f0;
  local_d0 = &local_120;
  local_c8 = (WithinRelMatcher *)local_118;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,&local_e0);
  Catch::ITransientExpression::~ITransientExpression(&local_e0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xbd;
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  capturedExpression_21.m_size = 0xb;
  capturedExpression_21.m_start = "2 == d.NP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_21,(SourceLineInfo *)local_118,
             capturedExpression_21,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start == 0x10;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce370;
  local_110._4_4_ = 2;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xbe;
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  capturedExpression_22.m_size = 0x15;
  capturedExpression_22.m_start = "2 == d.numberPoints()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_22,(SourceLineInfo *)local_118,
             capturedExpression_22,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start == 0x10;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce370;
  local_110._4_4_ = 2;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xbf;
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  capturedExpression_23.m_size = 0xb;
  capturedExpression_23.m_start = "1 == d.NR()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_23,(SourceLineInfo *)local_118,
             capturedExpression_23,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce370;
  local_110._4_4_ = 1;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xc0;
  macroName_24.m_size = 5;
  macroName_24.m_start = "CHECK";
  capturedExpression_24.m_size = 0x23;
  capturedExpression_24.m_start = "1 == d.numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_24,(SourceLineInfo *)local_118,
             capturedExpression_24,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce370;
  local_110._4_4_ = 1;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xc1;
  macroName_25.m_size = 5;
  macroName_25.m_start = "CHECK";
  capturedExpression_25.m_size = 0x13;
  capturedExpression_25.m_start = "1 == d.NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_25,(SourceLineInfo *)local_118,
             capturedExpression_25,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce3b0;
  local_110._4_4_ = 1;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xc2;
  macroName_26.m_size = 5;
  macroName_26.m_start = "CHECK";
  capturedExpression_26.m_size = 0x13;
  capturedExpression_26.m_start = "1 == d.INT().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_26,(SourceLineInfo *)local_118,
             capturedExpression_26,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce3b0;
  local_110._4_4_ = 1;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xc3;
  macroName_27.m_size = 5;
  macroName_27.m_start = "CHECK";
  capturedExpression_27.m_size = 0xf;
  capturedExpression_27.m_start = "2 == d.NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_27,(SourceLineInfo *)local_118,
             capturedExpression_27,ContinueOnFailure);
  local_100[0]._8_8_ =
       *d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_110._1_1_ = local_100[0]._8_8_ == 2;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce370;
  local_110._4_4_ = 2;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xc4;
  macroName_28.m_size = 5;
  macroName_28.m_start = "CHECK";
  capturedExpression_28.m_size = 0xf;
  capturedExpression_28.m_start = "2 == d.INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_28,(SourceLineInfo *)local_118,
             capturedExpression_28,ContinueOnFailure);
  local_100[0]._8_8_ =
       *d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_110._1_1_ = local_100[0]._8_8_ == 2;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce370;
  local_110._4_4_ = 2;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xc5;
  macroName_29.m_size = 5;
  macroName_29.m_start = "CHECK";
  capturedExpression_29.m_size = 0x1a;
  capturedExpression_29.m_start = "1 == d.boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_29,(SourceLineInfo *)local_118,
             capturedExpression_29,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce3b0;
  local_110._4_4_ = 1;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xc6;
  macroName_30.m_size = 5;
  macroName_30.m_start = "CHECK";
  capturedExpression_30.m_size = 0x1c;
  capturedExpression_30.m_start = "1 == d.interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_30,(SourceLineInfo *)local_118,
             capturedExpression_30,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce3b0;
  local_110._4_4_ = 1;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xc7;
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  capturedExpression_31.m_size = 0x16;
  capturedExpression_31.m_start = "2 == d.boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_31,(SourceLineInfo *)local_118,
             capturedExpression_31,ContinueOnFailure);
  local_100[0]._8_8_ =
       *d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_110._1_1_ = local_100[0]._8_8_ == 2;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce370;
  local_110._4_4_ = 2;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xc8;
  macroName_32.m_size = 5;
  macroName_32.m_start = "CHECK";
  capturedExpression_32.m_size = 0x18;
  capturedExpression_32.m_start = "2 == d.interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_32,(SourceLineInfo *)local_118,
             capturedExpression_32,ContinueOnFailure);
  local_100[0]._8_8_ =
       *d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_110._1_1_ = local_100[0]._8_8_ == 2;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce370;
  local_110._4_4_ = 2;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xc9;
  macroName_33.m_size = 5;
  macroName_33.m_start = "CHECK";
  capturedExpression_33.m_size = 0x17;
  capturedExpression_33.m_start = "2 == d.cosines().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_33,(SourceLineInfo *)local_118,
             capturedExpression_33,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start == 0x10;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce3b0;
  local_110._4_4_ = 2;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xca;
  macroName_34.m_size = 10;
  macroName_34.m_start = "CHECK_THAT";
  capturedExpression_34.m_size = 0x21;
  capturedExpression_34.m_start = "-1.0, WithinRel( d.cosines()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_34,(SourceLineInfo *)local_118,
             capturedExpression_34,ContinueOnFailure);
  local_120 = -1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_118,
             *d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_e0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_118,&local_120);
  local_e0.m_isBinaryExpression = true;
  local_e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ce3f0;
  local_d0 = &local_120;
  local_c8 = (WithinRelMatcher *)local_118;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,&local_e0);
  Catch::ITransientExpression::~ITransientExpression(&local_e0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xcb;
  macroName_35.m_size = 10;
  macroName_35.m_start = "CHECK_THAT";
  capturedExpression_35.m_size = 0x20;
  capturedExpression_35.m_start = "1.0, WithinRel( d.cosines()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_35,(SourceLineInfo *)local_118,
             capturedExpression_35,ContinueOnFailure);
  local_120 = 1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_118,
             d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  local_e0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_118,&local_120);
  local_e0.m_isBinaryExpression = true;
  local_e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ce3f0;
  local_d0 = &local_120;
  local_c8 = (WithinRelMatcher *)local_118;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,&local_e0);
  Catch::ITransientExpression::~ITransientExpression(&local_e0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xcc;
  macroName_36.m_size = 5;
  macroName_36.m_start = "CHECK";
  capturedExpression_36.m_size = 0x1d;
  capturedExpression_36.m_start = "2 == d.probabilities().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_36,(SourceLineInfo *)local_118,
             capturedExpression_36,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)d.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)d.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start == 0x10;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce3b0;
  local_110._4_4_ = 2;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xcd;
  macroName_37.m_size = 10;
  macroName_37.m_start = "CHECK_THAT";
  capturedExpression_37.m_size = 0x26;
  capturedExpression_37.m_start = "0.5, WithinRel( d.probabilities()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_37,(SourceLineInfo *)local_118,
             capturedExpression_37,ContinueOnFailure);
  local_120 = 0.5;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_118,
             *d.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_e0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_118,&local_120);
  local_e0.m_isBinaryExpression = true;
  local_e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ce3f0;
  local_d0 = &local_120;
  local_c8 = (WithinRelMatcher *)local_118;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,&local_e0);
  Catch::ITransientExpression::~ITransientExpression(&local_e0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xce;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x26;
  capturedExpression_38.m_start = "0.5, WithinRel( d.probabilities()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_38,(SourceLineInfo *)local_118,
             capturedExpression_38,ContinueOnFailure);
  local_120 = 0.5;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_118,
             d.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  local_e0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_118,&local_120);
  local_e0.m_isBinaryExpression = true;
  local_e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ce3f0;
  local_d0 = &local_120;
  local_c8 = (WithinRelMatcher *)local_118;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,&local_e0);
  Catch::ITransientExpression::~ITransientExpression(&local_e0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  njoy::ENDFtk::TabulationRecord::operator=
            (&d.super_TabulationRecord,
             &(chunk->
              super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>).
              super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
              .sequence_.
              super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
              ._M_impl.super__Vector_impl_data._M_start[1].super_TabulationRecord);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xd1;
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  capturedExpression_39.m_size = 0x18;
  capturedExpression_39.m_start = "2e+7, WithinRel( d.E() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_39,(SourceLineInfo *)local_118,
             capturedExpression_39,ContinueOnFailure);
  local_120 = 20000000.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_118,
             d.super_TabulationRecord.super_InterpolationBase.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  local_e0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_118,&local_120);
  local_e0.m_isBinaryExpression = true;
  local_e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ce3f0;
  local_d0 = &local_120;
  local_c8 = (WithinRelMatcher *)local_118;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,&local_e0);
  Catch::ITransientExpression::~ITransientExpression(&local_e0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xd2;
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  capturedExpression_40.m_size = 0x25;
  capturedExpression_40.m_start = "2e+7, WithinRel( d.incidentEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_40,(SourceLineInfo *)local_118,
             capturedExpression_40,ContinueOnFailure);
  local_120 = 20000000.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_118,
             d.super_TabulationRecord.super_InterpolationBase.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  local_e0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_118,&local_120);
  local_e0.m_isBinaryExpression = true;
  local_e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ce3f0;
  local_d0 = &local_120;
  local_c8 = (WithinRelMatcher *)local_118;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,&local_e0);
  Catch::ITransientExpression::~ITransientExpression(&local_e0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xd3;
  macroName_41.m_size = 5;
  macroName_41.m_start = "CHECK";
  capturedExpression_41.m_size = 0xb;
  capturedExpression_41.m_start = "3 == d.NP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_41,(SourceLineInfo *)local_118,
             capturedExpression_41,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start == 0x18;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce370;
  local_110._4_4_ = 3;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xd4;
  macroName_42.m_size = 5;
  macroName_42.m_start = "CHECK";
  capturedExpression_42.m_size = 0x15;
  capturedExpression_42.m_start = "3 == d.numberPoints()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_42,(SourceLineInfo *)local_118,
             capturedExpression_42,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start == 0x18;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce370;
  local_110._4_4_ = 3;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xd5;
  macroName_43.m_size = 5;
  macroName_43.m_start = "CHECK";
  capturedExpression_43.m_size = 0xb;
  capturedExpression_43.m_start = "1 == d.NR()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_43,(SourceLineInfo *)local_118,
             capturedExpression_43,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce370;
  local_110._4_4_ = 1;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xd6;
  macroName_44.m_size = 5;
  macroName_44.m_start = "CHECK";
  capturedExpression_44.m_size = 0x23;
  capturedExpression_44.m_start = "1 == d.numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_44,(SourceLineInfo *)local_118,
             capturedExpression_44,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce370;
  local_110._4_4_ = 1;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xd7;
  macroName_45.m_size = 5;
  macroName_45.m_start = "CHECK";
  capturedExpression_45.m_size = 0x13;
  capturedExpression_45.m_start = "1 == d.NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_45,(SourceLineInfo *)local_118,
             capturedExpression_45,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce3b0;
  local_110._4_4_ = 1;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xd8;
  macroName_46.m_size = 5;
  macroName_46.m_start = "CHECK";
  capturedExpression_46.m_size = 0x13;
  capturedExpression_46.m_start = "1 == d.INT().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_46,(SourceLineInfo *)local_118,
             capturedExpression_46,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce3b0;
  local_110._4_4_ = 1;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xd9;
  macroName_47.m_size = 5;
  macroName_47.m_start = "CHECK";
  capturedExpression_47.m_size = 0xf;
  capturedExpression_47.m_start = "3 == d.NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_47,(SourceLineInfo *)local_118,
             capturedExpression_47,ContinueOnFailure);
  local_100[0]._8_8_ =
       *d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_110._1_1_ = local_100[0]._8_8_ == 3;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce370;
  local_110._4_4_ = 3;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xda;
  macroName_48.m_size = 5;
  macroName_48.m_start = "CHECK";
  capturedExpression_48.m_size = 0xf;
  capturedExpression_48.m_start = "2 == d.INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_48,(SourceLineInfo *)local_118,
             capturedExpression_48,ContinueOnFailure);
  local_100[0]._8_8_ =
       *d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_110._1_1_ = local_100[0]._8_8_ == 2;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce370;
  local_110._4_4_ = 2;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xdb;
  macroName_49.m_size = 5;
  macroName_49.m_start = "CHECK";
  capturedExpression_49.m_size = 0x1a;
  capturedExpression_49.m_start = "1 == d.boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_49,(SourceLineInfo *)local_118,
             capturedExpression_49,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce3b0;
  local_110._4_4_ = 1;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xdc;
  macroName_50.m_size = 5;
  macroName_50.m_start = "CHECK";
  capturedExpression_50.m_size = 0x1c;
  capturedExpression_50.m_start = "1 == d.interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_50,(SourceLineInfo *)local_118,
             capturedExpression_50,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce3b0;
  local_110._4_4_ = 1;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xdd;
  macroName_51.m_size = 5;
  macroName_51.m_start = "CHECK";
  capturedExpression_51.m_size = 0x16;
  capturedExpression_51.m_start = "3 == d.boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_51,(SourceLineInfo *)local_118,
             capturedExpression_51,ContinueOnFailure);
  local_100[0]._8_8_ =
       *d.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_110._1_1_ = local_100[0]._8_8_ == 3;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce370;
  local_110._4_4_ = 3;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xde;
  macroName_52.m_size = 5;
  macroName_52.m_start = "CHECK";
  capturedExpression_52.m_size = 0x18;
  capturedExpression_52.m_start = "2 == d.interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_52,(SourceLineInfo *)local_118,
             capturedExpression_52,ContinueOnFailure);
  local_100[0]._8_8_ =
       *d.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_110._1_1_ = local_100[0]._8_8_ == 2;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce370;
  local_110._4_4_ = 2;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xdf;
  macroName_53.m_size = 5;
  macroName_53.m_start = "CHECK";
  capturedExpression_53.m_size = 0x17;
  capturedExpression_53.m_start = "3 == d.cosines().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_53,(SourceLineInfo *)local_118,
             capturedExpression_53,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start == 0x18;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce3b0;
  local_110._4_4_ = 3;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xe0;
  macroName_54.m_size = 10;
  macroName_54.m_start = "CHECK_THAT";
  capturedExpression_54.m_size = 0x21;
  capturedExpression_54.m_start = "-1.0, WithinRel( d.cosines()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_54,(SourceLineInfo *)local_118,
             capturedExpression_54,ContinueOnFailure);
  local_120 = -1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_118,
             *d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_e0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_118,&local_120);
  local_e0.m_isBinaryExpression = true;
  local_e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ce3f0;
  local_d0 = &local_120;
  local_c8 = (WithinRelMatcher *)local_118;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,&local_e0);
  Catch::ITransientExpression::~ITransientExpression(&local_e0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xe1;
  macroName_55.m_size = 10;
  macroName_55.m_start = "CHECK_THAT";
  capturedExpression_55.m_size = 0x20;
  capturedExpression_55.m_start = "0.0, WithinRel( d.cosines()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_55,(SourceLineInfo *)local_118,
             capturedExpression_55,ContinueOnFailure);
  local_120 = 0.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_118,
             d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  local_e0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_118,&local_120);
  local_e0.m_isBinaryExpression = true;
  local_e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ce3f0;
  local_d0 = &local_120;
  local_c8 = (WithinRelMatcher *)local_118;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,&local_e0);
  Catch::ITransientExpression::~ITransientExpression(&local_e0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xe2;
  macroName_56.m_size = 10;
  macroName_56.m_start = "CHECK_THAT";
  capturedExpression_56.m_size = 0x20;
  capturedExpression_56.m_start = "1.0, WithinRel( d.cosines()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_56,(SourceLineInfo *)local_118,
             capturedExpression_56,ContinueOnFailure);
  local_120 = 1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_118,
             d.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[2]);
  local_e0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_118,&local_120);
  local_e0.m_isBinaryExpression = true;
  local_e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ce3f0;
  local_d0 = &local_120;
  local_c8 = (WithinRelMatcher *)local_118;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,&local_e0);
  Catch::ITransientExpression::~ITransientExpression(&local_e0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xe3;
  macroName_57.m_size = 5;
  macroName_57.m_start = "CHECK";
  capturedExpression_57.m_size = 0x1d;
  capturedExpression_57.m_start = "3 == d.probabilities().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_57,(SourceLineInfo *)local_118,
             capturedExpression_57,ContinueOnFailure);
  local_100[0]._8_8_ =
       (long)d.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)d.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  local_110._1_1_ =
       (long)d.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)d.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start == 0x18;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce3b0;
  local_110._4_4_ = 3;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xe4;
  macroName_58.m_size = 10;
  macroName_58.m_start = "CHECK_THAT";
  capturedExpression_58.m_size = 0x26;
  capturedExpression_58.m_start = "0.0, WithinRel( d.probabilities()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_58,(SourceLineInfo *)local_118,
             capturedExpression_58,ContinueOnFailure);
  local_120 = 0.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_118,
             *d.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_e0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_118,&local_120);
  local_e0.m_isBinaryExpression = true;
  local_e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ce3f0;
  local_d0 = &local_120;
  local_c8 = (WithinRelMatcher *)local_118;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,&local_e0);
  Catch::ITransientExpression::~ITransientExpression(&local_e0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xe5;
  macroName_59.m_size = 10;
  macroName_59.m_start = "CHECK_THAT";
  capturedExpression_59.m_size = 0x26;
  capturedExpression_59.m_start = "1.0, WithinRel( d.probabilities()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_59,(SourceLineInfo *)local_118,
             capturedExpression_59,ContinueOnFailure);
  local_120 = 1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_118,
             d.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  local_e0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_118,&local_120);
  local_e0.m_isBinaryExpression = true;
  local_e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ce3f0;
  local_d0 = &local_120;
  local_c8 = (WithinRelMatcher *)local_118;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,&local_e0);
  Catch::ITransientExpression::~ITransientExpression(&local_e0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xe6;
  macroName_60.m_size = 10;
  macroName_60.m_start = "CHECK_THAT";
  capturedExpression_60.m_size = 0x26;
  capturedExpression_60.m_start = "0.0, WithinRel( d.probabilities()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_60,(SourceLineInfo *)local_118,
             capturedExpression_60,ContinueOnFailure);
  local_120 = 0.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_118,
             d.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[2]);
  local_e0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_118,&local_120);
  local_e0.m_isBinaryExpression = true;
  local_e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ce3f0;
  local_d0 = &local_120;
  local_c8 = (WithinRelMatcher *)local_118;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,&local_e0);
  Catch::ITransientExpression::~ITransientExpression(&local_e0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  local_118 = (undefined1  [8])0x18148c;
  local_110 = (pointer)0xe8;
  macroName_61.m_size = 5;
  macroName_61.m_start = "CHECK";
  capturedExpression_61.m_size = 0xf;
  capturedExpression_61.m_start = "8 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_20,macroName_61,(SourceLineInfo *)local_118,
             capturedExpression_61,ContinueOnFailure);
  local_100[0]._8_8_ =
       njoy::ENDFtk::
       InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>::NC
                 ((InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                   *)chunk);
  local_110._1_1_ = local_100[0]._8_8_ == 8;
  local_110._0_1_ = true;
  local_118 = (undefined1  [8])&PTR_streamReconstructedExpression_001ce370;
  local_110._4_4_ = 8;
  local_108 = (ITransientExpression *)0x182b3e;
  local_100[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_20,(ITransientExpression *)local_118);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_118);
  Catch::AssertionHandler::complete(&catchAssertionHandler_20);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_20);
  njoy::ENDFtk::TabulationRecord::~TabulationRecord(&d.super_TabulationRecord);
  return;
}

Assistant:

void verifyChunk( const TabulatedDistributions& chunk ) {

  CHECK( false == chunk.LI() );
  CHECK( false == chunk.isotropicDistributions() );
  CHECK( 2 == chunk.LTT() );
  CHECK( 2 == chunk.LAW() );

  CHECK( 2 == chunk.NE() );
  CHECK( 2 == chunk.numberIncidentEnergies() );
  CHECK( 1 == chunk.NR() );
  CHECK( 1 == chunk.numberInterpolationRegions() );
  CHECK( 1 == chunk.interpolants().size() );
  CHECK( 1 == chunk.boundaries().size() );
  CHECK( 1 == chunk.interpolants()[0] );
  CHECK( 2 == chunk.boundaries()[0] );
  CHECK( 1 == chunk.INT().size() );
  CHECK( 1 == chunk.NBT().size() );
  CHECK( 1 == chunk.INT()[0] );
  CHECK( 2 == chunk.NBT()[0] );

  CHECK( 2 == chunk.incidentEnergies().size() );
  CHECK( 2 == chunk.angularDistributions().size() );

  CHECK_THAT( 1e-5, WithinRel( chunk.incidentEnergies()[0] ) );
  CHECK_THAT( 2e+7, WithinRel( chunk.incidentEnergies()[1] ) );

  auto distributions = chunk.angularDistributions();

  auto d = distributions[0];
  CHECK_THAT( 1e-5, WithinRel( d.E() ) );
  CHECK_THAT( 1e-5, WithinRel( d.incidentEnergy() ) );
  CHECK( 2 == d.NP() );
  CHECK( 2 == d.numberPoints() );
  CHECK( 1 == d.NR() );
  CHECK( 1 == d.numberInterpolationRegions() );
  CHECK( 1 == d.NBT().size() );
  CHECK( 1 == d.INT().size() );
  CHECK( 2 == d.NBT()[0] );
  CHECK( 2 == d.INT()[0] );
  CHECK( 1 == d.boundaries().size() );
  CHECK( 1 == d.interpolants().size() );
  CHECK( 2 == d.boundaries()[0] );
  CHECK( 2 == d.interpolants()[0] );
  CHECK( 2 == d.cosines().size() );
  CHECK_THAT( -1.0 , WithinRel( d.cosines()[0] ) );
  CHECK_THAT( 1.0, WithinRel( d.cosines()[1] ) );
  CHECK( 2 == d.probabilities().size() );
  CHECK_THAT( 0.5 , WithinRel( d.probabilities()[0] ) );
  CHECK_THAT( 0.5, WithinRel( d.probabilities()[1] ) );

  d = distributions[1];
  CHECK_THAT( 2e+7, WithinRel( d.E() ) );
  CHECK_THAT( 2e+7, WithinRel( d.incidentEnergy() ) );
  CHECK( 3 == d.NP() );
  CHECK( 3 == d.numberPoints() );
  CHECK( 1 == d.NR() );
  CHECK( 1 == d.numberInterpolationRegions() );
  CHECK( 1 == d.NBT().size() );
  CHECK( 1 == d.INT().size() );
  CHECK( 3 == d.NBT()[0] );
  CHECK( 2 == d.INT()[0] );
  CHECK( 1 == d.boundaries().size() );
  CHECK( 1 == d.interpolants().size() );
  CHECK( 3 == d.boundaries()[0] );
  CHECK( 2 == d.interpolants()[0] );
  CHECK( 3 == d.cosines().size() );
  CHECK_THAT( -1.0 , WithinRel( d.cosines()[0] ) );
  CHECK_THAT( 0.0, WithinRel( d.cosines()[1] ) );
  CHECK_THAT( 1.0, WithinRel( d.cosines()[2] ) );
  CHECK( 3 == d.probabilities().size() );
  CHECK_THAT( 0.0 , WithinRel( d.probabilities()[0] ) );
  CHECK_THAT( 1.0, WithinRel( d.probabilities()[1] ) );
  CHECK_THAT( 0.0, WithinRel( d.probabilities()[2] ) );

  CHECK( 8 == chunk.NC() );
}